

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test9::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test9 *this,_test_case *test_case)

{
  long lVar1;
  pointer pcVar2;
  uint uVar3;
  _variable_type _Var4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type extraout_EDX;
  _variable_type type_04;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  GPUShaderFP64Test9 *pGVar11;
  ulong uVar12;
  string *psVar13;
  bool bVar14;
  bool bVar15;
  string ref2_variable_type;
  string ref2_variable_type_fp_string;
  string ref2_variable_name;
  string variable_type_string;
  string result_variable_type_string;
  string ref2_variable_type_string;
  string variable_type_fp_string;
  stringstream result_sstream;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  string *local_280;
  string local_278;
  long *local_258;
  long local_250;
  long local_248 [2];
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_280 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeString_abi_cxx11_(&local_218,(Utils *)(ulong)test_case->variable_type,type);
  Utils::getFPVariableTypeStringForVariableType_abi_cxx11_
            (&local_1d8,(Utils *)(ulong)test_case->variable_type,type_00);
  Utils::getVariableTypeString_abi_cxx11_
            (&local_238,(Utils *)(ulong)test_case->variable_type,type_01);
  uVar3 = Utils::getNumberOfComponentsForVariableType(test_case->variable_type);
  if (((test_case->operation_type == OPERATION_TYPE_MULTIPLICATION) &&
      (_Var4 = test_case->variable_type, _Var4 < VARIABLE_TYPE_UINT)) &&
     ((0x7fc03fe0U >> (_Var4 & VARIABLE_TYPE_UINT) & 1) != 0)) {
    _Var4 = Utils::getTransposedMatrixVariableType(_Var4);
    _Var4 = Utils::getPostMatrixMultiplicationVariableType(test_case->variable_type,_Var4);
    Utils::getVariableTypeString_abi_cxx11_(&local_278,(Utils *)(ulong)_Var4,type_02);
    std::__cxx11::string::operator=((string *)&local_218,(string *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    test_case->result_variable_type = _Var4;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#version 400\n\nout ",0x12);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             " result;\nout ivec2 result_lt;\nout ivec2 result_lte;\nout ivec2 result_gt;\nout ivec2 result_gte;\nvoid main()\n{\n"
             ,0x6d);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," reference1 = ",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  uVar12 = 1;
  do {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    if (uVar12 - (uVar3 - 1) != 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    }
    bVar14 = uVar12 != uVar3;
    uVar12 = uVar12 + 1;
  } while (bVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
  bVar14 = true;
  uVar8 = extraout_RDX;
  do {
    type_03 = (_variable_type)uVar8;
    _Var4 = test_case->variable_type;
    if (((_Var4 < VARIABLE_TYPE_UINT) && ((0x7fc03fe0U >> (_Var4 & VARIABLE_TYPE_UINT) & 1) != 0))
       && (test_case->operation_type == OPERATION_TYPE_MULTIPLICATION)) {
      _Var4 = Utils::getTransposedMatrixVariableType(_Var4);
      type_03 = extraout_EDX;
    }
    Utils::getFPVariableTypeStringForVariableType_abi_cxx11_
              (&local_278,(Utils *)(ulong)_Var4,type_03);
    Utils::getVariableTypeString_abi_cxx11_(&local_1f8,(Utils *)(ulong)_Var4,type_04);
    psVar13 = &local_1f8;
    if (bVar14) {
      psVar13 = &local_278;
    }
    local_2a0 = local_290;
    pcVar2 = (psVar13->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + psVar13->_M_string_length);
    iVar10 = 0x1a42ad3;
    if (bVar14) {
      iVar10 = 0x1a42aba;
    }
    local_258 = local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,iVar10,iVar10 + (uint)bVar14 + 10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_2a0,local_298);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_258,local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2a0,local_298);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    lVar9 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      if (-lVar9 != (ulong)(uVar3 - 1)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      lVar1 = lVar9 + ((ulong)uVar3 - 1);
      lVar9 = lVar9 + -1;
    } while (lVar1 != 0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
    uVar8 = extraout_RDX_00;
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
      uVar8 = extraout_RDX_01;
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
      uVar8 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      uVar8 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      uVar8 = extraout_RDX_04;
    }
    bVar15 = bVar14 != false;
    bVar14 = false;
  } while (bVar15);
  pGVar11 = (GPUShaderFP64Test9 *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nresult = ",10);
  if ((test_case->operation_type & ~OPERATION_TYPE_DIVISION) == OPERATION_TYPE_PRE_DECREMENTATION) {
    pcVar6 = getOperatorForOperationType(pGVar11,&test_case->operation_type);
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
  }
  pGVar11 = (GPUShaderFP64Test9 *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"reference1 ",0xb);
  if ((test_case->operation_type & ~OPERATION_TYPE_SUBTRACTION) == OPERATION_TYPE_PRE_DECREMENTATION
     ) {
    if ((~test_case->operation_type & 6) != 0) goto LAB_0093d028;
    pcVar6 = getOperatorForOperationType(pGVar11,&test_case->operation_type);
    sVar7 = strlen(pcVar6);
  }
  else {
    pcVar6 = getOperatorForOperationType(pGVar11,&test_case->operation_type);
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    sVar7 = 0xb;
    pcVar6 = " reference2";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
LAB_0093d028:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  if ((test_case->variable_type < VARIABLE_TYPE_UVEC2) &&
     ((0x80060011U >> (test_case->variable_type & VARIABLE_TYPE_UINT) & 1) != 0)) {
    lVar9 = 0x1a8;
    pcVar6 = 
    "result_lt [0] = (reference1 <  reference2)  ? 1 : 0;\nresult_lt [1] = (reference1 <  reference2f) ? 1 : 0;\nresult_lte[0] = (reference1 <= reference2)  ? 1 : 0;\nresult_lte[1] = (reference1 <= reference2f) ? 1 : 0;\nresult_gt [0] = (reference1 >  reference2)  ? 1 : 0;\nresult_gt [1] = (reference1 >  reference2f) ? 1 : 0;\nresult_gte[0] = (reference1 >= reference2)  ? 1 : 0;\nresult_gte[1] = (reference1 >= reference2f) ? 1 : 0;\n"
    ;
  }
  else {
    lVar9 = 0x98;
    pcVar6 = 
    "result_lt [0] = 1;\nresult_lt [1] = 1;\nresult_lte[0] = 1;\nresult_lte[1] = 1;\nresult_gt [0] = 1;\nresult_gt [1] = 1;\nresult_gte[0] = 1;\nresult_gte[1] = 1;\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_280;
}

Assistant:

std::string GPUShaderFP64Test9::getVertexShaderBody(_test_case& test_case)
{
	std::stringstream  result_sstream;
	std::string		   result_variable_type_string = Utils::getVariableTypeString(test_case.variable_type);
	std::string		   variable_type_fp_string = Utils::getFPVariableTypeStringForVariableType(test_case.variable_type);
	std::string		   variable_type_string	= Utils::getVariableTypeString(test_case.variable_type);
	const unsigned int n_variable_components   = Utils::getNumberOfComponentsForVariableType(test_case.variable_type);

	/* If we are to multiply matrices, we will need to use a different type
	 * for the result variable if either of the matrices is not square.
	 */
	if (test_case.operation_type == OPERATION_TYPE_MULTIPLICATION &&
		Utils::isMatrixVariableType(test_case.variable_type))
	{
		Utils::_variable_type result_variable_type;
		Utils::_variable_type transposed_matrix_variable_type =
			Utils::getTransposedMatrixVariableType(test_case.variable_type);

		result_variable_type =
			Utils::getPostMatrixMultiplicationVariableType(test_case.variable_type, transposed_matrix_variable_type);
		result_variable_type_string = Utils::getVariableTypeString(result_variable_type);

		test_case.result_variable_type = result_variable_type;
	}

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

					  /* Add output variables */
					  "out "
				   << result_variable_type_string << " result;\n"
													 "out ivec2 result_lt;\n"
													 "out ivec2 result_lte;\n"
													 "out ivec2 result_gt;\n"
													 "out ivec2 result_gte;\n"
													 "void main()\n"
													 "{\n";

	/* Form reference values */
	result_sstream << variable_type_string << " reference1 = " << variable_type_string << "(";

	for (unsigned int n_variable_component = 0; n_variable_component < n_variable_components; ++n_variable_component)
	{
		result_sstream << (n_variable_component + 1);

		if (n_variable_component != (n_variable_components - 1))
		{
			result_sstream << ", ";
		}
	} /* for (all variable components) */

	result_sstream << ");\n";

	for (unsigned int n_ref2_case = 0; n_ref2_case < 2; /* single- and double-precision cases */
		 ++n_ref2_case)
	{
		Utils::_variable_type compatible_variable_type = test_case.variable_type;

		if (Utils::isMatrixVariableType(compatible_variable_type) &&
			test_case.operation_type == OPERATION_TYPE_MULTIPLICATION)
		{
			compatible_variable_type = Utils::getTransposedMatrixVariableType(compatible_variable_type);
		}

		std::string ref2_variable_type_fp_string =
			Utils::getFPVariableTypeStringForVariableType(compatible_variable_type);
		std::string ref2_variable_type_string = Utils::getVariableTypeString(compatible_variable_type);
		std::string ref2_variable_type = (n_ref2_case == 0) ? ref2_variable_type_fp_string : ref2_variable_type_string;
		std::string ref2_variable_name = (n_ref2_case == 0) ? "reference2f" : "reference2";

		result_sstream << ref2_variable_type << " " << ref2_variable_name << " = " << ref2_variable_type << "(";

		for (unsigned int n_variable_component = 0; n_variable_component < n_variable_components;
			 ++n_variable_component)
		{
			result_sstream << (n_variable_components - (n_variable_component + 1));

			if (n_variable_component != (n_variable_components - 1))
			{
				result_sstream << ", ";
			}
		} /* for (all variable components) */

		result_sstream << ");\n";
	} /* for (both reference2 declarations) */

	/* Add actual body */
	result_sstream << "\n"
					  "result = ";

	if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION)
	{
		result_sstream << getOperatorForOperationType(test_case.operation_type);
	}

	result_sstream << "reference1 ";

	if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
	{
		if (test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION ||
			test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
		{
			result_sstream << getOperatorForOperationType(test_case.operation_type);
		}
	}
	else
	{
		result_sstream << getOperatorForOperationType(test_case.operation_type) << " reference2";
	}

	result_sstream << ";\n";

	if (Utils::isScalarVariableType(test_case.variable_type))
	{
		result_sstream << "result_lt [0] = (reference1 <  reference2)  ? 1 : 0;\n"
						  "result_lt [1] = (reference1 <  reference2f) ? 1 : 0;\n"
						  "result_lte[0] = (reference1 <= reference2)  ? 1 : 0;\n"
						  "result_lte[1] = (reference1 <= reference2f) ? 1 : 0;\n"
						  "result_gt [0] = (reference1 >  reference2)  ? 1 : 0;\n"
						  "result_gt [1] = (reference1 >  reference2f) ? 1 : 0;\n"
						  "result_gte[0] = (reference1 >= reference2)  ? 1 : 0;\n"
						  "result_gte[1] = (reference1 >= reference2f) ? 1 : 0;\n";
	}
	else
	{
		result_sstream << "result_lt [0] = 1;\n"
						  "result_lt [1] = 1;\n"
						  "result_lte[0] = 1;\n"
						  "result_lte[1] = 1;\n"
						  "result_gt [0] = 1;\n"
						  "result_gt [1] = 1;\n"
						  "result_gte[0] = 1;\n"
						  "result_gte[1] = 1;\n";
	}

	result_sstream << "}\n";

	/* All done */
	return result_sstream.str();
}